

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_native(int n,u_long *numbers,char **error)

{
  dev_t dev;
  char **error_local;
  u_long *numbers_local;
  int n_local;
  
  dev = 0;
  if (n == 2) {
    dev = (*numbers & 0xff) << 8 | numbers[1] & 0xffff00ff;
    if ((long)(int)((uint)(dev >> 8) & 0xff) == *numbers) {
      if ((long)(int)((uint)dev & 0xffff00ff) != numbers[1]) {
        *error = "invalid minor number";
      }
    }
    else {
      *error = "invalid major number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return dev;
}

Assistant:

dev_t
pack_native(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = apd_makedev(numbers[0], numbers[1]);
		if ((u_long)major(dev) != numbers[0])
			*error = iMajorError;
		else if ((u_long)minor(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}